

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

arith_uint256 * __thiscall
anon_unknown.dwarf_22c7f6c::PeerManagerImpl::GetAntiDoSWorkThreshold
          (arith_uint256 *__return_storage_ptr__,PeerManagerImpl *this)

{
  pointer ppCVar1;
  Chainstate *pCVar2;
  base_uint<256U> *pbVar3;
  arith_uint256 *__b;
  CBlockIndex *block;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock59;
  arith_uint256 near_chaintip_work;
  unique_lock<std::recursive_mutex> uStack_118;
  base_uint<256U> local_108;
  base_uint<256U> local_e8;
  base_uint<256U> local_c8;
  base_uint<256U> local_a8;
  base_uint<256U> local_88;
  base_uint<256U> local_68;
  base_uint<256U> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint<256U>::base_uint(&local_48,0);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_118,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0xaaa,false);
  pCVar2 = ChainstateManager::ActiveChainstate(this->m_chainman);
  ppCVar1 = (pCVar2->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((ppCVar1 !=
       (pCVar2->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
       _M_impl.super__Vector_impl_data._M_start) && (ppCVar1[-1] != (CBlockIndex *)0x0)) {
    pCVar2 = ChainstateManager::ActiveChainstate(this->m_chainman);
    ppCVar1 = (pCVar2->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar1 ==
        (pCVar2->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      block = (CBlockIndex *)0x0;
    }
    else {
      block = ppCVar1[-1];
    }
    base_uint<256U>::base_uint(&local_e8,0x90);
    GetBlockProof((arith_uint256 *)&local_108,block);
    ::operator*(&local_c8,&local_e8,&local_108);
    base_uint<256U>::base_uint(&local_a8,&local_c8);
    pbVar3 = &std::min<arith_uint256>((arith_uint256 *)&local_a8,&block->nChainWork)->
              super_base_uint<256U>;
    ::operator-(&local_88,&(block->nChainWork).super_base_uint<256U>,pbVar3);
    base_uint<256U>::base_uint(&local_68,&local_88);
    base_uint<256U>::operator=(&local_48,&local_68);
  }
  __b = ChainstateManager::MinimumChainWork(this->m_chainman);
  pbVar3 = &std::max<arith_uint256>((arith_uint256 *)&local_48,__b)->super_base_uint<256U>;
  base_uint<256U>::base_uint(&__return_storage_ptr__->super_base_uint<256U>,pbVar3);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_118);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

arith_uint256 PeerManagerImpl::GetAntiDoSWorkThreshold()
{
    arith_uint256 near_chaintip_work = 0;
    LOCK(cs_main);
    if (m_chainman.ActiveChain().Tip() != nullptr) {
        const CBlockIndex *tip = m_chainman.ActiveChain().Tip();
        // Use a 144 block buffer, so that we'll accept headers that fork from
        // near our tip.
        near_chaintip_work = tip->nChainWork - std::min<arith_uint256>(144*GetBlockProof(*tip), tip->nChainWork);
    }
    return std::max(near_chaintip_work, m_chainman.MinimumChainWork());
}